

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O3

void TypeCheck_MethodCall(KonohaContext *kctx,KonohaStack *sfp)

{
  kNameSpace *expr;
  KClass *pKVar1;
  kFunc **ppkVar2;
  kToken *pkVar3;
  KClass *c;
  _func_kNode_ptr_KonohaContext_ptr_kNode_ptr_kToken_ptr_kNameSpace_ptr_kinfotag_t_char_ptr_varargs
  *p_Var4;
  _func_uintptr_t_KonohaContext_ptr_kObject_ptr *p_Var5;
  kArray *pkVar6;
  undefined8 uVar7;
  kNameSpace *pkVar8;
  kMethod *mtd;
  byte *pbVar9;
  KClass *pKVar10;
  kString *pkVar11;
  uintptr_t uVar12;
  undefined8 uVar13;
  ulong uVar14;
  long lVar15;
  kNameSpace *ns;
  KMethodMatch local_68;
  
  expr = (kNameSpace *)sfp[1].field_0.asNode;
  pKVar1 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
  pkVar8 = expr;
  do {
    ns = ((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar8->importedNameSpaceList)->StmtNameSpace;
    if ((((anon_union_8_4_b004c7c0_for_kNodeVar_7 *)&pkVar8->importedNameSpaceList)->StmtNameSpace->
        h).ct == pKVar1) break;
    pkVar8 = ((anon_union_8_2_7d56b7f0_for_kNodeVar_3 *)&pkVar8->packageId)->RootNodeNameSpace;
    ns = pkVar8;
  } while ((pkVar8->h).ct != pKVar1);
  pKVar1 = ((sfp[3].field_0.asObject)->h).ct;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_MethodCall",0x2f3,"tracing..");
  (*kctx->klib->DumpObject)
            (kctx,(kObject_conflict *)expr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_MethodCall",0x2f5);
  if (((expr->importedNameSpaceList->h).ct)->baseTypeId != 6) {
    __assert_fail("((((expr->NodeList)->h.ct)->baseTypeId) == KType_Array)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
                  ,0x2f6,"void TypeCheck_MethodCall(KonohaContext *, KonohaStack *)");
  }
  mtd = *(expr->importedNameSpaceList->field_2).MethodItems;
  if (mtd == (kMethod *)0x0) {
    __assert_fail("mtd != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
                  ,0x2f8,"void TypeCheck_MethodCall(KonohaContext *, KonohaStack *)");
  }
  if (((mtd->h).ct)->baseTypeId == 8) {
LAB_00114a2b:
    pkVar8 = (kNameSpace *)TypeCheckMethodParam(kctx,mtd,(kNode *)expr,ns,pKVar1);
  }
  else {
    pkVar8 = (kNameSpace *)
             (*kctx->klib->TypeCheckNodeAt)
                       (kctx,(kNode *)expr,1,ns,
                        (KClass *)
                        (((kctx->share->classTable).field_1.keyValueItems)->field_2).ObjectValue,0);
    if (*(int *)&pkVar8->parentNULL == 0x18) goto LAB_00114cc4;
    ppkVar2 = (expr->importedNameSpaceList->field_2).FuncItems;
    pkVar3 = (kToken *)*ppkVar2;
    if ((pkVar3->h).ct != (KClass *)(*kctx->runtimeModels)[1].setupModelContext) {
      __assert_fail("(((methodToken)->h.ct) == ((KParserModel *)kctx->runtimeModels[0])->cToken)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
                    ,0x2d7,"kMethod *LookupMethod(KonohaContext *, kNode *, kNameSpace *)");
    }
    c = *(KClass **)
         ((kctx->share->classTable).field_1.bytebuf +
         (ulong)(*(uint *)((long)&ppkVar2[1]->method + 4) & 0xfffffff) * 8);
    lVar15 = (expr->importedNameSpaceList->bytesize >> 3) - 2;
    mtd = kNameSpace_GetMethodByParamSizeNULL
                    (kctx,ns,c,pkVar3->symbol,(int)lVar15,KMethodMatch_CamelStyle);
    if ((mtd == (kMethod *)0x0) && (lVar15 == 0)) {
      pbVar9 = (byte *)(*((((pkVar3->field_2).text)->h).ct)->unbox)
                                 (kctx,(kObject_conflict *)(pkVar3->field_2).text);
      if ((pbVar9[1] == 0x6f) &&
         (((*pbVar9 | 0x20) == 0x74 &&
          (pKVar10 = (*kctx->klib->kNameSpace_GetClassByFullName)
                               (kctx,ns,(char *)(pbVar9 + 2),((pkVar3->field_2).text)->bytesize - 2,
                                (KClass *)0x0), pKVar10 != (KClass *)0x0)))) {
        mtd = (*kctx->klib->kNameSpace_GetCoercionMethodNULL)(kctx,ns,c,pKVar10);
        goto LAB_00114b66;
      }
LAB_00114b6f:
      if ((pkVar3->field_2).text == kctx->share->emptyString) {
        mtd = (kMethod *)0x0;
      }
      else {
        local_68.ns = (kNameSpace *)0x0;
        local_68.isBreak = false;
        local_68._33_7_ = 0;
        local_68.foundMethodNULL = (kMethod *)0x0;
        local_68.paramdom = 0;
        local_68._20_4_ = 0;
        local_68.param = (kparamtype_t *)0x0;
        local_68.foundMethodListNULL = (kArray *)0x0;
        local_68.mn = 0;
        local_68.paramsize = 1;
        mtd = kNameSpace_MatchMethodNULL(kctx,ns,c,KMethodMatch_ParamSize,&local_68);
      }
      p_Var4 = kctx->klib->MessageNode;
      pkVar11 = (*kctx->klib->KClass_shortName)(kctx,c);
      p_Var5 = ((pkVar11->h).ct)->unbox;
      pkVar11 = (*kctx->klib->KClass_shortName)(kctx,c);
      uVar12 = (*p_Var5)(kctx,(kObject_conflict *)pkVar11);
      pkVar6 = kctx->share->symbolList;
      uVar14 = (ulong)(pkVar3->symbol & 0xfffffff);
      if (pkVar6->bytesize >> 3 <= uVar14) {
        __assert_fail("index < (((kctx->share->symbolList)->bytesize)/sizeof(void *))",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/include/konoha3/klib.h"
                      ,0x54,"kString *KSymbol_GetString(KonohaContext *, ksymbol_t)");
      }
      uVar7 = *(undefined8 *)(KSymbol_prefixText_prefixes + (ulong)(pkVar3->symbol >> 0x1d) * 8);
      uVar13 = (**(code **)(*(long *)((pkVar6->field_2).unboxItems[uVar14] + 8) + 0x20))(kctx);
      (*p_Var4)(kctx,(kNode *)expr,pkVar3,ns,ErrTag,"undefined method: %s.%s%s",uVar12,uVar7,uVar13)
      ;
      if (mtd != (kMethod *)0x0) goto LAB_00114c8f;
    }
    else {
LAB_00114b66:
      if (mtd == (kMethod *)0x0) goto LAB_00114b6f;
LAB_00114c8f:
      if (((mtd->flag & 0x80000) == 0) ||
         (mtd = LookupOverloadedMethod(kctx,mtd,(kNode *)expr,ns), mtd != (kMethod *)0x0))
      goto LAB_00114a2b;
    }
    if (*(int *)&pkVar8->parentNULL != 0x18) {
      pkVar8 = expr;
    }
  }
LAB_00114cc4:
  sfp[-4].field_0.asNode = (kNode *)pkVar8;
  (*kctx->klib->CheckSafePoint)(kctx,sfp,0);
  return;
}

Assistant:

static KMETHOD TypeCheck_MethodCall(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_TypeCheck(expr, ns, reqc);
	kNode *texpr = K_NULLNODE;
	KDump(expr);
	DBG_ASSERT(IS_Array(expr->NodeList));
	kMethod *mtd = expr->NodeList->MethodItems[0];
	DBG_ASSERT(mtd != NULL);
	if(!IS_Method(mtd)) {
		texpr = KLIB TypeCheckNodeAt(kctx, expr, 1, ns, KClass_INFER, 0);
		mtd = (kNode_IsError(texpr)) ? NULL : LookupMethod(kctx, expr, ns);
	}
	if(mtd != NULL) {
		texpr = TypeCheckMethodParam(kctx, mtd, expr, ns, reqc);
		KReturn(texpr);
	}
	if(kNode_IsError(texpr)) {
		KReturn(texpr);
	}
	KReturn(expr);
}